

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

void handle_splicing(token *word)

{
  ulong local_20;
  size_t front;
  size_t back;
  token *word_local;
  
  if (word->data_size != 0) {
    for (local_20 = 0; local_20 < word->data_size - 1; local_20 = local_20 + 1) {
      if ((word->data[local_20] == '\\') && (word->data[local_20 + 1] == '\n')) {
        local_20 = local_20 + 2;
        break;
      }
    }
    if (local_20 != word->data_size - 1) {
      front = local_20 - 2;
      while (local_20 < word->data_size - 1) {
        if ((word->data[local_20] == '\\') && (word->data[local_20 + 1] == '\n')) {
          local_20 = local_20 + 2;
        }
        else {
          word->data[front] = word->data[local_20];
          local_20 = local_20 + 1;
          front = front + 1;
        }
      }
      word->data[front] = word->data[local_20];
    }
  }
  return;
}

Assistant:

void handle_splicing(struct token *word)
{
	size_t back;
	size_t front;
	if(word->data_size==0)
		return;
	front=0;
	for(front;front<word->data_size-1;++front)
	{
		if(word->data[front]=='\\' && word->data[front+1]=='\n')
		{
			front+=2;
			break;
		}
	}
	if(front==word->data_size-1)
		return;

	for(back=front-2;front<word->data_size-1;)
	{
		if(word->data[front]=='\\' && word->data[front+1]=='\n')
		{
			front+=2;
		}else
		{
			word->data[back]=word->data[front];
			++front;
			++back;
		}
	}
	word->data[back]=word->data[front];
}